

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnIfExpr(BinaryReaderInterp *this,Type sig_type)

{
  Result RVar1;
  Offset fixup_offset;
  Location loc;
  Location local_38;
  
  local_38.field_1.field_0.last_column = 0;
  local_38.filename._M_len = (this->filename_)._M_len;
  local_38.filename._M_str = (this->filename_)._M_str;
  local_38.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnIf(&this->validator_,&local_38,sig_type);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,InterpBrUnless);
    fixup_offset = Istream::EmitFixupU32(this->istream_);
    PushLabel(this,Block,0xffffffff,fixup_offset,0xffffffff);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnIfExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnIf(GetLocation(), sig_type));
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  PushLabel(LabelKind::Block, Istream::kInvalidOffset, fixup);
  return Result::Ok;
}